

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::PlaTask::checkArguments
          (PlaTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  Type *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Type *this_01;
  ConstantRange CVar5;
  long lVar6;
  Expression *arg;
  ulong uVar7;
  Type *local_50;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,3,3);
  lVar6 = 400;
  if (bVar2) {
    bVar2 = (args->_M_extent)._M_extent_value != 0;
    if (bVar2) {
      uVar7 = 0;
      do {
        this_00 = (args->_M_ptr[uVar7]->type).ptr;
        if (uVar7 == 0) {
          bVar3 = Type::isUnpackedArray(this_00);
          if (!bVar3) {
            arg = *args->_M_ptr;
            goto LAB_0041cd49;
          }
          this_01 = Type::getArrayElementType(this_00);
          bVar3 = Type::isSimpleBitVector(this_01);
          if (bVar3) {
            if (this_01->canonical == (Type *)0x0) {
              Type::resolveCanonical(this_01);
            }
            if ((this_01->canonical->super_Symbol).kind == PredefinedIntegerType) goto LAB_0041ccdf;
            bVar4 = Type::hasFixedRange(this_01);
            bVar3 = true;
            if (((bVar4) && ((*args->_M_ptr)->kind != Concatenation)) &&
               (CVar5 = Type::getFixedRange(this_01), CVar5.right < CVar5.left)) {
              local_50 = badRange(context,*args->_M_ptr);
              goto LAB_0041ccf2;
            }
          }
          else {
LAB_0041ccdf:
            local_50 = SystemSubroutine::badArg((SystemSubroutine *)this,context,*args->_M_ptr);
LAB_0041ccf2:
            bVar3 = false;
          }
          if (bVar3) goto LAB_0041cd04;
          bVar3 = false;
        }
        else {
          bVar3 = Type::isSimpleBitVector(this_00);
          if (bVar3) {
            if (this_00->canonical == (Type *)0x0) {
              Type::resolveCanonical(this_00);
            }
            if ((this_00->canonical->super_Symbol).kind == PredefinedIntegerType) goto LAB_0041cc93;
LAB_0041cd04:
            bVar4 = Type::hasFixedRange(this_00);
            bVar3 = true;
            if (((!bVar4) || (args->_M_ptr[uVar7]->kind == Concatenation)) ||
               (CVar5 = Type::getFixedRange(this_00), CVar5.left <= CVar5.right)) goto LAB_0041cd5d;
            local_50 = badRange(context,args->_M_ptr[uVar7]);
          }
          else {
LAB_0041cc93:
            arg = args->_M_ptr[uVar7];
LAB_0041cd49:
            local_50 = SystemSubroutine::badArg((SystemSubroutine *)this,context,arg);
          }
          bVar3 = false;
        }
LAB_0041cd5d:
        if (!bVar3) break;
        uVar7 = uVar7 + 1;
        bVar2 = uVar7 < (args->_M_extent)._M_extent_value;
      } while (bVar2);
    }
    lVar6 = 0x188;
    if (bVar2) {
      return local_50;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar6);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();

        if (!checkArgCount(context, false, args, range, 3, 3))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            auto& type = *args[i]->type;

            if (i == 0) {
                if (!type.isUnpackedArray()) {
                    return badArg(context, *args[i]);
                }

                auto& elemType = *type.getArrayElementType();
                if (!elemType.isSimpleBitVector() || elemType.isPredefinedInteger()) {
                    return badArg(context, *args[i]);
                }

                if (elemType.hasFixedRange() && args[i]->kind != ExpressionKind::Concatenation &&
                    !isValidRange(elemType)) {
                    return badRange(context, *args[i]);
                }
            }
            else {
                if (!type.isSimpleBitVector() || type.isPredefinedInteger()) {
                    return badArg(context, *args[i]);
                }
            }

            if (type.hasFixedRange() && args[i]->kind != ExpressionKind::Concatenation &&
                !isValidRange(type)) {
                return badRange(context, *args[i]);
            }
        }

        return comp.getVoidType();
    }